

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

Var __thiscall Js::ScopeSlots::Get(ScopeSlots *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((this->slotArray).ptr)->ptr <= (void *)(ulong)i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xdc6,"(i < GetCount())","i < GetCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (this->slotArray).ptr[i + 2].ptr;
}

Assistant:

Var Get(uint i) const
        {
            Assert(i < GetCount());
            return slotArray[i + FirstSlotIndex];
        }